

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-async.c
# Opt level: O3

void worker_async_cb(uv_async_t *handle)

{
  undefined8 uVar1;
  int iVar2;
  uv_async_t *handle_00;
  uv_loop_t *loop;
  uv_loop_t *handle_01;
  uint uVar3;
  
  handle_00 = handle + -1;
  iVar2 = uv_async_send(handle_00);
  if (iVar2 == 0) {
    uVar1 = *(undefined8 *)((long)&handle[1].loop + 4);
    uVar3 = (int)uVar1 + 1;
    *(ulong *)((long)&handle[1].loop + 4) = CONCAT44((int)((ulong)uVar1 >> 0x20) + 1,uVar3);
    if (999999 < uVar3) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  worker_async_cb_cold_1();
  loop = (uv_loop_t *)(handle_00 + 1);
  iVar2 = uv_async_send((uv_async_t *)loop);
  if (iVar2 == 0) {
    uVar1 = *(undefined8 *)((long)&handle_00[2].data + 4);
    uVar3 = (int)uVar1 + 1;
    *(ulong *)((long)&handle_00[2].data + 4) = CONCAT44((int)((ulong)uVar1 >> 0x20) + 1,uVar3);
    if (999999 < uVar3) {
      uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  main_async_cb_cold_1();
  handle_01 = (uv_loop_t *)&loop[1].active_handles;
  iVar2 = uv_async_send((uv_async_t *)handle_01);
  if (iVar2 == 0) {
    handle_01 = loop;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 == 0) {
      uv_loop_close(loop);
      return;
    }
  }
  else {
    worker_cold_1();
  }
  worker_cold_2();
  iVar2 = uv_is_closing((uv_handle_t *)handle_01);
  if (iVar2 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle_01,(uv_close_cb)0x0);
  return;
}

Assistant:

static void worker_async_cb(uv_async_t* handle) {
  struct ctx* ctx = container_of(handle, struct ctx, worker_async);

  ASSERT(0 == uv_async_send(&ctx->main_async));
  ctx->worker_sent++;
  ctx->worker_seen++;

  if (ctx->worker_sent >= NUM_PINGS)
    uv_close((uv_handle_t*) &ctx->worker_async, NULL);
}